

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::VelocityField::getValue(VelocityField *this,StuntDouble *sd)

{
  StuntDouble *in_RDX;
  Vector3d *in_RDI;
  
  StuntDouble::getVel(in_RDX);
  return in_RDI;
}

Assistant:

Vector3d VelocityField::getValue(StuntDouble* sd) { return sd->getVel(); }